

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nap_comm.cpp
# Opt level: O0

void __thiscall RandomCommTest_TestsInTests_Test::TestBody(RandomCommTest_TestsInTests_Test *this)

{
  value_type vVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  reference ppoVar6;
  ompi_request_t **ppoVar7;
  int *abs_error;
  int *val2;
  int *val1;
  int *expr2;
  vector<double,_std::allocator<double>_> *send_vals_00;
  MPIX_Data *this_00;
  int *lhs;
  NAPData *nap_data_00;
  MPI_Datatype datatype;
  MPI_Comm comm;
  NAPComm *nap_comm_00;
  MPI_Comm comm_00;
  char *pcVar8;
  AssertionResult gtest_ar_1;
  int i_5;
  vector<double,_std::allocator<double>_> nap_recv_d_vals;
  vector<double,_std::allocator<double>_> std_recv_d_vals;
  int i_4;
  vector<double,_std::allocator<double>_> send_d_vals;
  AssertionResult gtest_ar;
  int i_3;
  NAPData nap_data;
  vector<int,_std::allocator<int>_> nap_recv_vals;
  vector<int,_std::allocator<int>_> std_recv_vals;
  int i_2;
  int val;
  vector<int,_std::allocator<int>_> send_vals;
  NAPComm *nap_comm;
  int end_1;
  int start_1;
  int proc_1;
  int i_1;
  int idx;
  int j;
  int end;
  int start;
  int proc;
  int i;
  int tag;
  vector<int,_std::allocator<int>_> global_recv_idx;
  vector<int,_std::allocator<int>_> global_send_idx;
  int first;
  MPIX_Data recv_data;
  MPIX_Data send_data;
  int local_size;
  int num_procs;
  int rank;
  MPIX_Data *in_stack_fffffffffffffba0;
  allocator_type *in_stack_fffffffffffffbb0;
  allocator_type *__a;
  size_type in_stack_fffffffffffffbb8;
  char *lhs_expression;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  undefined1 uVar9;
  NAPData *in_stack_fffffffffffffbe8;
  NAPData *nap_data_01;
  MPI_Comm in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  int iVar10;
  int tag_00;
  undefined4 in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc04;
  NAPComm *in_stack_fffffffffffffc08;
  void *in_stack_fffffffffffffc10;
  undefined1 *buf;
  Message *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  NAPData *in_stack_fffffffffffffc28;
  undefined1 *puVar11;
  MPIX_Data *recv_data_00;
  undefined4 in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  NAPComm *nap_comm_01;
  MPIX_Data *recv_vals;
  MPIX_Data *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  undefined8 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  AssertionResult local_2d0;
  int local_2c0;
  pointer in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd54;
  pointer in_stack_fffffffffffffd58;
  int *in_stack_fffffffffffffd60;
  pointer in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd74;
  int local_280;
  undefined1 local_279 [9];
  int *in_stack_fffffffffffffd90;
  int *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  uint uVar12;
  MPI_Comm in_stack_fffffffffffffda8;
  NAPComm **in_stack_fffffffffffffdb0;
  AssertionResult local_248;
  int local_234;
  NAPData local_230;
  undefined1 local_209;
  vector<int,_std::allocator<int>_> local_208;
  undefined1 local_1e9 [29];
  int local_1cc;
  int local_1c8;
  undefined1 local_1c1 [25];
  char local_1a8 [8];
  int local_1a0;
  int local_19c;
  value_type local_198;
  int local_194;
  int local_190;
  value_type local_18c;
  int local_188;
  value_type local_184;
  value_type local_180;
  int local_17c;
  undefined4 local_178;
  vector<int,_std::allocator<int>_> local_170;
  vector<int,_std::allocator<int>_> local_150;
  int local_138;
  int local_128;
  int local_124;
  vector<int,_std::allocator<int>_> local_120;
  vector<int,_std::allocator<int>_> local_108 [2];
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> local_d8 [2];
  int local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> local_58 [2];
  int local_24;
  undefined1 local_20 [4];
  int local_1c [3];
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  MPI_Comm_rank(&ompi_mpi_comm_world,local_1c);
  MPI_Comm_size(&ompi_mpi_comm_world,local_20);
  setenv("PPN","4",1);
  local_24 = 10000;
  MPIX_Data::MPIX_Data(in_stack_fffffffffffffba0);
  MPIX_Data::MPIX_Data(in_stack_fffffffffffffba0);
  form_initial_communicator
            (iVar4,(MPIX_Data *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  local_138 = local_24 * local_1c[0];
  std::allocator<int>::allocator((allocator<int> *)0x15567b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
             in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::allocator<int>::~allocator((allocator<int> *)0x1556a7);
  std::allocator<int>::allocator((allocator<int> *)0x1556cc);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
             in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::allocator<int>::~allocator((allocator<int> *)0x1556f8);
  local_178 = 0x72aa;
  for (local_17c = 0; local_17c < local_a8; local_17c = local_17c + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)local_17c);
    local_180 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_88,(long)local_17c);
    local_184 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_88,(long)(local_17c + 1));
    local_188 = *pvVar5;
    for (local_18c = local_184; local_18c < local_188; local_18c = local_18c + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_18c);
      local_190 = *pvVar5;
      iVar4 = local_138 + local_190;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_150,(long)local_18c);
      *pvVar5 = iVar4;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_150,(long)local_184);
    uVar2 = local_178;
    vVar1 = local_180;
    iVar4 = local_188 - local_184;
    ppoVar6 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                        (local_58,(long)local_17c);
    MPI_Isend(pvVar5,iVar4,&ompi_mpi_int,vVar1,uVar2,&ompi_mpi_comm_world,ppoVar6);
  }
  for (local_194 = 0; local_194 < local_128; local_194 = local_194 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_120,(long)local_194);
    local_198 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_108,(long)local_194);
    local_19c = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_108,(long)(local_194 + 1));
    local_1a0 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_170,(long)local_19c);
    uVar2 = local_178;
    vVar1 = local_198;
    iVar4 = local_1a0 - local_19c;
    ppoVar6 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                        (local_d8,(long)local_194);
    MPI_Irecv(pvVar5,iVar4,&ompi_mpi_int,vVar1,uVar2,&ompi_mpi_comm_world,ppoVar6);
  }
  if (local_a8 != 0) {
    ppoVar7 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data
                        ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x155ab1);
    MPI_Waitall(local_a8,ppoVar7,0);
    in_stack_fffffffffffffcac = local_a8;
  }
  if (local_128 != 0) {
    in_stack_fffffffffffffca8 = local_128;
    ppoVar7 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data
                        ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x155aed);
    MPI_Waitall(in_stack_fffffffffffffca8,ppoVar7,0);
  }
  abs_error = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x155b1f);
  val2 = std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x155b34)
  ;
  val1 = std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x155b49)
  ;
  expr2 = std::vector<int,_std::allocator<int>_>::data
                    ((vector<int,_std::allocator<int>_> *)0x155b6c);
  send_vals_00 = (vector<double,_std::allocator<double>_> *)
                 std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x155b81);
  this_00 = (MPIX_Data *)
            std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x155b96);
  lhs = std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x155bab);
  lhs_expression = local_1a8;
  __a = (allocator_type *)&ompi_mpi_comm_world;
  recv_vals = this_00;
  MPIX_NAPinit(in_stack_fffffffffffffd74,(int *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (int *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
               (int *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd90,in_stack_fffffffffffffd98,
               (int *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
  nap_data_00 = (NAPData *)(long)local_24;
  nap_comm_01 = (NAPComm *)local_1c1;
  std::allocator<int>::allocator((allocator<int> *)0x155c3e);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
             (size_type)lhs_expression,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x155c6a);
  local_1c8 = local_24 * local_1c[0];
  iVar4 = local_128;
  for (local_1cc = 0; iVar10 = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20), local_1cc < local_24
      ; local_1cc = local_1cc + 1) {
    in_stack_fffffffffffffc54 = local_1c8;
    local_1c8 = local_1c8 + 1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_1c1 + 1),(long)local_1cc);
    *pvVar5 = in_stack_fffffffffffffc54;
  }
  datatype = (MPI_Datatype)(long)local_124;
  recv_data_00 = (MPIX_Data *)local_1e9;
  std::allocator<int>::allocator((allocator<int> *)0x155d2f);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
             (size_type)lhs_expression,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x155d5b);
  comm = (MPI_Comm)(long)local_124;
  puVar11 = &local_209;
  std::allocator<int>::allocator((allocator<int> *)0x155d80);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
             (size_type)lhs_expression,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x155dac);
  standard_communication<int>
            ((vector<int,_std::allocator<int>_> *)send_vals_00,
             (vector<int,_std::allocator<int>_> *)recv_vals,(int)((ulong)nap_comm_01 >> 0x20),
             (MPI_Datatype)nap_data_00,
             (MPIX_Data *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),recv_data_00
            );
  NAPData::NAPData(&local_230);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x155dfb);
  MPIX_INAPsend((void *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                (NAPComm *)recv_data_00,datatype,(int)((ulong)puVar11 >> 0x20),comm,
                in_stack_fffffffffffffc28);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x155e35);
  MPIX_INAPrecv(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                (MPI_Datatype)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),iVar10,
                in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  MPIX_NAPwait(nap_comm_01,nap_data_00);
  for (local_234 = 0; local_234 < local_124; local_234 = local_234 + 1) {
    in_stack_fffffffffffffc28 =
         (NAPData *)
         std::vector<int,_std::allocator<int>_>::operator[]
                   ((vector<int,_std::allocator<int>_> *)(local_1e9 + 1),(long)local_234);
    std::vector<int,_std::allocator<int>_>::operator[](&local_208,(long)local_234);
    testing::internal::EqHelper<false>::Compare<int,int>
              (lhs_expression,(char *)__a,lhs,&this_00->num_msgs);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    in_stack_fffffffffffffc27 = bVar3;
    if (!bVar3) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      in_stack_fffffffffffffc18 =
           (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x155fb7);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                 (Type)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0,
                 (int)((ulong)lhs_expression >> 0x20),(char *)__a);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                 in_stack_fffffffffffffc18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::Message::~Message((Message *)0x15601a);
    }
    uVar12 = (uint)!bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x156085);
    if (uVar12 != 0) goto LAB_00156587;
  }
  nap_comm_00 = (NAPComm *)(long)local_24;
  buf = local_279;
  std::allocator<double>::allocator((allocator<double> *)0x1560df);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbc0,(size_type)lhs_expression,(allocator_type *)__a);
  std::allocator<double>::~allocator((allocator<double> *)0x156105);
  local_1c8 = local_24 * local_1c[0];
  for (local_280 = 0; iVar10 = (int)((ulong)puVar11 >> 0x20), local_280 < local_24;
      local_280 = local_280 + 1) {
    in_stack_fffffffffffffc04 = local_1c8;
    local_1c8 = local_1c8 + 1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_1c1 + 1),(long)local_280);
    *pvVar5 = in_stack_fffffffffffffc04;
  }
  comm_00 = (MPI_Comm)(long)local_124;
  tag_00 = (int)((ulong)&stack0xfffffffffffffd67 >> 0x20);
  std::allocator<double>::allocator((allocator<double> *)0x1561be);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbc0,(size_type)lhs_expression,(allocator_type *)__a);
  std::allocator<double>::~allocator((allocator<double> *)0x1561e4);
  nap_data_01 = (NAPData *)&stack0xfffffffffffffd47;
  std::allocator<double>::allocator((allocator<double> *)0x156203);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbc0,(size_type)lhs_expression,(allocator_type *)__a);
  std::allocator<double>::~allocator((allocator<double> *)0x156229);
  standard_communication<double>
            (send_vals_00,(vector<double,_std::allocator<double>_> *)recv_vals,
             (int)((ulong)nap_comm_01 >> 0x20),(MPI_Datatype)nap_data_00,
             (MPIX_Data *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),recv_data_00
            );
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x156269);
  MPIX_INAPsend((void *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                (NAPComm *)recv_data_00,datatype,iVar10,comm,in_stack_fffffffffffffc28);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x1562a3);
  MPIX_INAPrecv(buf,nap_comm_00,
                (MPI_Datatype)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),tag_00,
                comm_00,nap_data_01);
  MPIX_NAPwait(nap_comm_01,nap_data_00);
  for (local_2c0 = 0; local_2c0 < local_124; local_2c0 = local_2c0 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffd68,(long)local_2c0);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffd48,(long)local_2c0);
    testing::internal::DoubleNearPredFormat
              ((char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),(char *)expr2,
               (char *)CONCAT44(iVar4,in_stack_fffffffffffffc98),(double)val1,(double)val2,
               (double)abs_error);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
    if (!bVar3) {
      uVar9 = bVar3;
      testing::Message::Message((Message *)CONCAT17(bVar3,in_stack_fffffffffffffbd0));
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x15642f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar9,in_stack_fffffffffffffbd0),
                 (Type)((ulong)pcVar8 >> 0x20),(char *)in_stack_fffffffffffffbc0,
                 (int)((ulong)lhs_expression >> 0x20),(char *)__a);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                 in_stack_fffffffffffffc18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::Message::~Message((Message *)0x15648c);
    }
    uVar12 = (uint)!bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1564f7);
    if (uVar12 != 0) goto LAB_00156560;
  }
  MPIX_NAPDestroy((NAPComm **)__a);
  setenv("PPN","16",1);
LAB_00156560:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a);
LAB_00156587:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  MPIX_Data::~MPIX_Data(this_00);
  MPIX_Data::~MPIX_Data(this_00);
  return;
}

Assistant:

TEST(RandomCommTest, TestsInTests)
{
    // Get MPI Information
    int rank, num_procs;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    MPI_Comm_size(MPI_COMM_WORLD, &num_procs);

    setenv("PPN", "4", 1);

    // Initial communication info (standard)
    int local_size = 10000; // Number of variables each rank stores
    MPIX_Data send_data;
    MPIX_Data recv_data;
    form_initial_communicator(local_size, &send_data, &recv_data);

    // Determine unique global indices (map from send indices to recv indicies)
    int first = local_size * rank;
    std::vector<int> global_send_idx(send_data.size_msgs);
    std::vector<int> global_recv_idx(recv_data.size_msgs);
    int tag = 29354;
    for (int i = 0; i < send_data.num_msgs; i++)
    {
        int proc = send_data.procs[i];
        int start = send_data.indptr[i];
        int end = send_data.indptr[i+1];
        for (int j = start; j < end; j++)
        {
            int idx = send_data.indices[j];
            global_send_idx[j] = first + idx;
        }
        MPI_Isend(&global_send_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &send_data.requests[i]);
    }
    for (int i = 0; i < recv_data.num_msgs; i++)
    {
        int proc = recv_data.procs[i];
        int start = recv_data.indptr[i];
        int end = recv_data.indptr[i+1];
        MPI_Irecv(&global_recv_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &recv_data.requests[i]);
    }
    if (send_data.num_msgs) MPI_Waitall(send_data.num_msgs, 
            send_data.requests.data(), MPI_STATUSES_IGNORE);
    if (recv_data.num_msgs) MPI_Waitall(recv_data.num_msgs, 
            recv_data.requests.data(), MPI_STATUSES_IGNORE);

    // Initializing node-aware communication package
    NAPComm* nap_comm;
    MPIX_NAPinit(send_data.num_msgs, send_data.procs.data(), 
            send_data.indptr.data(), send_data.indices.data(), 
            recv_data.num_msgs, recv_data.procs.data(), 
            recv_data.indptr.data(), global_send_idx.data(),
            global_recv_idx.data(), MPI_COMM_WORLD, &nap_comm);

    // Test correctness of communication
    std::vector<int> send_vals(local_size);
    int val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<int> std_recv_vals(recv_data.size_msgs);
    std::vector<int> nap_recv_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_vals, std_recv_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    NAPData nap_data;
    MPIX_INAPsend(send_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_EQ(std_recv_vals[i], nap_recv_vals[i]);
    }
    
    std::vector<double> send_d_vals(local_size);
    val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<double> std_recv_d_vals(recv_data.size_msgs);
    std::vector<double> nap_recv_d_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_d_vals, std_recv_d_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    MPIX_INAPsend(send_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_NEAR(std_recv_d_vals[i], nap_recv_d_vals[i], 1e-10);
    }

    MPIX_NAPDestroy(&nap_comm);

    setenv("PPN", "16", 1);
}